

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O0

BOOL Js::JavascriptObject::ChangePrototype
               (RecyclableObject *object,RecyclableObject *newPrototype,bool shouldThrow,
               ScriptContext *scriptContext)

{
  code *pcVar1;
  Type TVar2;
  bool bVar3;
  byte bVar4;
  BOOL BVar5;
  int iVar6;
  TypeId typeId;
  undefined4 *puVar7;
  char *pcVar8;
  DynamicType *this;
  DynamicTypeHandler *this_00;
  ScriptContext *pSVar9;
  ThreadContext *pTVar10;
  RecyclableObject *pRVar11;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *this_01;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *this_02;
  DynamicObject *pDVar12;
  anon_class_16_2_9775b916 func;
  anon_class_16_2_9775b916 func_00;
  undefined1 local_80 [23];
  bool objectAndPrototypeChainHasOnlyWritableDataProperties;
  undefined1 local_61;
  Type TStack_60;
  bool objectAndPrototypeChainHasNoSpecialProperties;
  Type local_58;
  undefined1 local_49 [8];
  bool allProtoCachesInvalidated;
  DynamicObject *obj;
  Type TStack_38;
  bool isInvalidationOfInlineCacheNeeded;
  JavascriptProxy *proxy;
  ScriptContext *scriptContext_local;
  Type TStack_20;
  bool shouldThrow_local;
  RecyclableObject *newPrototype_local;
  RecyclableObject *object_local;
  
  proxy = (JavascriptProxy *)scriptContext;
  scriptContext_local._7_1_ = shouldThrow;
  TStack_20.ptr = (RuntimeFunction *)newPrototype;
  newPrototype_local = object;
  BVar5 = Js::JavascriptOperators::IsObject(object);
  if (BVar5 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0xac,"(JavascriptOperators::IsObject(object))",
                                "JavascriptOperators::IsObject(object)");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  BVar5 = Js::JavascriptOperators::IsObjectOrNull(TStack_20.ptr);
  if (BVar5 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0xad,"(JavascriptOperators::IsObjectOrNull(newPrototype))",
                                "JavascriptOperators::IsObjectOrNull(newPrototype)");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  bVar3 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>(newPrototype_local);
  TVar2.ptr = TStack_20.ptr;
  if (bVar3) {
    TStack_38.ptr =
         (RuntimeFunction *)VarTo<Js::JavascriptProxy,Js::RecyclableObject>(newPrototype_local);
    CrossSite::ForceCrossSiteThunkOnPrototypeChain((RecyclableObject *)TStack_20.ptr);
    BVar5 = Js::JavascriptProxy::SetPrototypeTrap
                      ((JavascriptProxy *)TStack_38.ptr,(RecyclableObject *)TStack_20.ptr,
                       (bool)(scriptContext_local._7_1_ & 1),(ScriptContext *)proxy);
    return BVar5;
  }
  pcVar8 = (char *)GetPrototypeOf(newPrototype_local,(ScriptContext *)proxy);
  if (TVar2.ptr == (RuntimeFunction *)pcVar8) {
    return 1;
  }
  iVar6 = (*(newPrototype_local->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x33])();
  if (iVar6 == 0) {
    if ((scriptContext_local._7_1_ & 1) == 0) {
      return 0;
    }
    JavascriptError::ThrowTypeError((ScriptContext *)proxy,-0x7ff5ec4a,(PCWSTR)0x0);
  }
  iVar6 = (*(newPrototype_local->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x34])();
  if (iVar6 != 0) {
    JavascriptError::ThrowTypeError((ScriptContext *)proxy,-0x7ff5ebe3,(PCWSTR)0x0);
  }
  bVar3 = IsPrototypeOfStopAtProxy
                    (newPrototype_local,(RecyclableObject *)TStack_20.ptr,(ScriptContext *)proxy);
  if (bVar3) {
    if ((scriptContext_local._7_1_ & 1) == 0) {
      return 0;
    }
    JavascriptError::ThrowTypeError((ScriptContext *)proxy,-0x7ff5ec50,(PCWSTR)0x0);
  }
  obj._7_1_ = 1;
  register0x00000000 =
       (RuntimeFunction *)VarTo<Js::DynamicObject,Js::RecyclableObject>(newPrototype_local);
  this = DynamicObject::GetDynamicType((DynamicObject *)register0x00000000);
  this_00 = DynamicType::GetTypeHandler(this);
  bVar4 = DynamicTypeHandler::GetFlags(this_00);
  if ((bVar4 & 0x20) == 0) {
    bVar3 = DynamicObject::HasLockedType((DynamicObject *)stack0xffffffffffffffb8);
    if (!bVar3) {
      DynamicObject::ChangeType((DynamicObject *)stack0xffffffffffffffb8);
    }
    pSVar9 = RecyclableObject::GetScriptContext((RecyclableObject *)stack0xffffffffffffffb8);
    pTVar10 = ScriptContext::GetThreadContext(pSVar9);
    bVar3 = ThreadContext::IsObjectRegisteredInProtoInlineCaches
                      (pTVar10,(DynamicObject *)stack0xffffffffffffffb8);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      pcVar8 = 
      "!obj->GetScriptContext()->GetThreadContext()->IsObjectRegisteredInProtoInlineCaches(obj)";
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                  ,0xf3,
                                  "(!obj->GetScriptContext()->GetThreadContext()->IsObjectRegisteredInProtoInlineCaches(obj))"
                                  ,
                                  "!obj->GetScriptContext()->GetThreadContext()->IsObjectRegisteredInProtoInlineCaches(obj)"
                                 );
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    pSVar9 = RecyclableObject::GetScriptContext((RecyclableObject *)stack0xffffffffffffffb8);
    pTVar10 = ScriptContext::GetThreadContext(pSVar9);
    bVar3 = ThreadContext::IsObjectRegisteredInStoreFieldInlineCaches
                      (pTVar10,(DynamicObject *)stack0xffffffffffffffb8);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      pcVar8 = 
      "!obj->GetScriptContext()->GetThreadContext()->IsObjectRegisteredInStoreFieldInlineCaches(obj)"
      ;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                  ,0xf4,
                                  "(!obj->GetScriptContext()->GetThreadContext()->IsObjectRegisteredInStoreFieldInlineCaches(obj))"
                                  ,
                                  "!obj->GetScriptContext()->GetThreadContext()->IsObjectRegisteredInStoreFieldInlineCaches(obj)"
                                 );
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    obj._7_1_ = 0;
  }
  if ((obj._7_1_ & 1) != 0) {
    local_49[0] = 0;
    Js::JavascriptOperators::
    MapObjectAndPrototypes<1,Js::JavascriptObject::ChangePrototype(Js::RecyclableObject*,Js::RecyclableObject*,bool,Js::ScriptContext*)::__0>
              (TStack_20.ptr);
    pRVar11 = RecyclableObject::GetPrototype(newPrototype_local);
    TStack_60.ptr = (RuntimeFunction *)&proxy;
    local_58.ptr = (RuntimeFunction *)local_49;
    func.allProtoCachesInvalidated = (bool *)pcVar8;
    func.scriptContext = (ScriptContext **)local_58.ptr;
    Js::JavascriptOperators::
    MapObjectAndPrototypesUntil<1,Js::JavascriptObject::ChangePrototype(Js::RecyclableObject*,Js::RecyclableObject*,bool,Js::ScriptContext*)::__1>
              ((JavascriptOperators *)pRVar11,(RecyclableObject *)TStack_60.ptr,func);
    local_61 = Js::JavascriptOperators::CheckIfObjectAndProtoChainHasNoSpecialProperties
                         ((RecyclableObject *)TStack_20.ptr);
    if ((bool)local_61) {
      pSVar9 = RecyclableObject::GetScriptContext(newPrototype_local);
      pcVar8 = (char *)RecyclableObject::GetScriptContext((RecyclableObject *)TStack_20.ptr);
      if (pSVar9 != (ScriptContext *)pcVar8) goto LAB_012d0a67;
    }
    else {
LAB_012d0a67:
      RecyclableObject::GetLibrary(newPrototype_local);
      JavascriptLibrary::GetTypesWithNoSpecialPropertyProtoChainCache
                ((JavascriptLibrary *)(local_80 + 0x10));
      this_01 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::
                operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> *)
                           (local_80 + 0x10));
      PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear(this_01);
    }
    local_80[0xf] =
         Js::JavascriptOperators::CheckIfObjectAndPrototypeChainHasOnlyWritableDataProperties
                   ((RecyclableObject *)TStack_20.ptr);
    if ((bool)local_80[0xf]) {
      pSVar9 = RecyclableObject::GetScriptContext(newPrototype_local);
      pcVar8 = (char *)RecyclableObject::GetScriptContext((RecyclableObject *)TStack_20.ptr);
      if (pSVar9 != (ScriptContext *)pcVar8) goto LAB_012d0ac9;
    }
    else {
LAB_012d0ac9:
      RecyclableObject::GetLibrary(newPrototype_local);
      JavascriptLibrary::GetTypesWithOnlyWritablePropertyProtoChainCache
                ((JavascriptLibrary *)local_80);
      this_02 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
                operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>
                            *)local_80);
      PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear(this_02);
    }
    if ((local_49[0] & 1) == 0) {
      func_00.allProtoCachesInvalidated = (bool *)pcVar8;
      func_00.scriptContext = (ScriptContext **)local_49;
      Js::JavascriptOperators::
      MapObjectAndPrototypesUntil<1,Js::JavascriptObject::ChangePrototype(Js::RecyclableObject*,Js::RecyclableObject*,bool,Js::ScriptContext*)::__2>
                ((JavascriptOperators *)TStack_20.ptr,(RecyclableObject *)&proxy,func_00);
    }
    pRVar11 = RecyclableObject::GetPrototype(newPrototype_local);
    Js::JavascriptOperators::
    MapObjectAndPrototypesUntil<1,Js::JavascriptObject::ChangePrototype(Js::RecyclableObject*,Js::RecyclableObject*,bool,Js::ScriptContext*)::__3>
              (pRVar11);
  }
  BVar5 = RecyclableObject::IsExternal(newPrototype_local);
  if (BVar5 == 0) {
    typeId = RecyclableObject::GetTypeId(newPrototype_local);
    bVar3 = DynamicType::Is(typeId);
    if (!bVar3) goto LAB_012d0b74;
    pDVar12 = UnsafeVarTo<Js::DynamicObject,Js::RecyclableObject>(newPrototype_local);
    iVar6 = (*(pDVar12->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
              ._vptr_IRecyclerVisitedObject[0x66])();
    if (iVar6 == 0) goto LAB_012d0b74;
  }
  CrossSite::ForceCrossSiteThunkOnPrototypeChain((RecyclableObject *)TStack_20.ptr);
LAB_012d0b74:
  (*(newPrototype_local->super_FinalizableObject).super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x4b])(newPrototype_local,TStack_20.ptr);
  return 1;
}

Assistant:

BOOL JavascriptObject::ChangePrototype(RecyclableObject* object, RecyclableObject* newPrototype, bool shouldThrow, ScriptContext* scriptContext)
{
    // 8.3.2    [[SetInheritance]] (V)
    // When the [[SetInheritance]] internal method of O is called with argument V the following steps are taken:
    // 1.   Assert: Either Type(V) is Object or Type(V) is Null.
    Assert(JavascriptOperators::IsObject(object));
    Assert(JavascriptOperators::IsObjectOrNull(newPrototype));

    if (VarIs<JavascriptProxy>(object))
    {
        JavascriptProxy* proxy = VarTo<JavascriptProxy>(object);
        CrossSite::ForceCrossSiteThunkOnPrototypeChain(newPrototype);
        return proxy->SetPrototypeTrap(newPrototype, shouldThrow, scriptContext);
    }

    // 2.   Let extensible be the value of the [[Extensible]] internal data property of O.
    // 3.   Let current be the value of the [[Prototype]] internal data property of O.
    // 4.   If SameValue(V, current), then return true.
    if (newPrototype == JavascriptObject::GetPrototypeOf(object, scriptContext))
    {
        return TRUE;
    }

    // 5.   If extensible is false, then return false.
    if (!object->IsExtensible())
    {
        if (shouldThrow)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NonExtensibleObject);
        }
        return FALSE;
    }

    if (object->IsProtoImmutable())
    {
        // ES2016 19.1.3:
        // The Object prototype object is the intrinsic object %ObjectPrototype%.
        // The Object prototype object is an immutable prototype exotic object.
        // ES2016 9.4.7:
        // An immutable prototype exotic object is an exotic object that has an immutable [[Prototype]] internal slot.
        JavascriptError::ThrowTypeError(scriptContext, JSERR_ImmutablePrototypeSlot);
    }

    // 6.   If V is not null, then
    //  a.  Let p be V.
    //  b.  Repeat, while p is not null
    //      i.  If SameValue(p, O) is true, then return false.
    //      ii. Let nextp be the result of calling the [[GetInheritance]] internal method of p with no arguments.
    //      iii.    ReturnIfAbrupt(nextp).
    //      iv. Let  p be nextp.
    if (IsPrototypeOfStopAtProxy(object, newPrototype, scriptContext)) // Reject cycle
    {
        if (shouldThrow)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_CyclicProtoValue);
        }
        return FALSE;
    }

    // 7.   Set the value of the [[Prototype]] internal data property of O to V.
    // 8.   Return true.

    bool isInvalidationOfInlineCacheNeeded = true;
    DynamicObject * obj = VarTo<DynamicObject>(object);

    // If this object was not prototype object, then no need to invalidate inline caches.
    // Simply assign it a new type so if this object used protoInlineCache in past, it will
    // be invalidated because of type mismatch and subsequently we will update its protoInlineCache
    if (!(obj->GetDynamicType()->GetTypeHandler()->GetFlags() & DynamicTypeHandler::IsPrototypeFlag))
    {
        // If object has locked type, skip changing its type here as it will be changed anyway below
        // when object gets newPrototype object.
        if (!obj->HasLockedType())
        {
            obj->ChangeType();
        }
        Assert(!obj->GetScriptContext()->GetThreadContext()->IsObjectRegisteredInProtoInlineCaches(obj));
        Assert(!obj->GetScriptContext()->GetThreadContext()->IsObjectRegisteredInStoreFieldInlineCaches(obj));
        isInvalidationOfInlineCacheNeeded = false;
    }

    if (isInvalidationOfInlineCacheNeeded)
    {
        bool allProtoCachesInvalidated = false;

        JavascriptOperators::MapObjectAndPrototypes<true>(newPrototype, [&](RecyclableObject* obj)
        {
            obj->ClearProtoCachesWereInvalidated();
        });

        // Notify old prototypes that they are being removed from a prototype chain. This triggers invalidating protocache, etc.
        JavascriptOperators::MapObjectAndPrototypesUntil<true>(object->GetPrototype(), [&](RecyclableObject* obj)->bool
        {
            obj->RemoveFromPrototype(scriptContext, &allProtoCachesInvalidated);
            return allProtoCachesInvalidated;
        });

        // Examine new prototype chain. If it brings in any special property, we need to invalidate related caches.
        bool objectAndPrototypeChainHasNoSpecialProperties =
            JavascriptOperators::CheckIfObjectAndProtoChainHasNoSpecialProperties(newPrototype);

        if (!objectAndPrototypeChainHasNoSpecialProperties
            || object->GetScriptContext() != newPrototype->GetScriptContext())
        {
            // The HaveNoSpecialProperties cache is cleared when a property is added or changed,
            // but only for types in the same script context. Therefore, if the prototype is in another
            // context, the object's cache won't be cleared when a property is added or changed on the prototype.
            // Moreover, an object is added to the cache only when its whole prototype chain is in the same
            // context.
            //
            // Since we don't have a way to find out which objects have a certain object as their prototype,
            // we clear the cache here instead.
            object->GetLibrary()->GetTypesWithNoSpecialPropertyProtoChainCache()->Clear();
        }

        // Examine new prototype chain. If it brings in any non-WritableData property, we need to invalidate related caches.
        bool objectAndPrototypeChainHasOnlyWritableDataProperties =
            JavascriptOperators::CheckIfObjectAndPrototypeChainHasOnlyWritableDataProperties(newPrototype);

        if (!objectAndPrototypeChainHasOnlyWritableDataProperties
            || object->GetScriptContext() != newPrototype->GetScriptContext())
        {
            // The HaveOnlyWritableDataProperties cache is cleared when a property is added or changed,
            // but only for types in the same script context. Therefore, if the prototype is in another
            // context, the object's cache won't be cleared when a property is added or changed on the prototype.
            // Moreover, an object is added to the cache only when its whole prototype chain is in the same
            // context.
            //
            // Since we don't have a way to find out which objects have a certain object as their prototype,
            // we clear the cache here instead.

            // Invalidate fast prototype chain writable data test flag
            object->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->Clear();
        }

        if (!allProtoCachesInvalidated)
        {
            // Invalidate StoreField/PropertyGuards for any non-WritableData property in the new chain
            JavascriptOperators::MapObjectAndPrototypesUntil<true>(newPrototype, [&](RecyclableObject* obj)->bool
            {
                obj->AddToPrototype(scriptContext, &allProtoCachesInvalidated);
                return allProtoCachesInvalidated;
            });
        }

        JavascriptOperators::MapObjectAndPrototypesUntil<true>(object->GetPrototype(), [](RecyclableObject* obj)->bool
        {
            return obj->ClearProtoCachesWereInvalidated();
        });
    }

    // Set to new prototype
    if (object->IsExternal() || (DynamicType::Is(object->GetTypeId()) && (UnsafeVarTo<DynamicObject>(object))->IsCrossSiteObject()))
    {
        CrossSite::ForceCrossSiteThunkOnPrototypeChain(newPrototype);
    }
    object->SetPrototype(newPrototype);
    return TRUE;
}